

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
               (CodedInputStream *input,float *value)

{
  bool bVar1;
  float fVar2;
  uint32 local_24;
  float *pfStack_20;
  uint32 temp;
  float *value_local;
  CodedInputStream *input_local;
  
  pfStack_20 = value;
  value_local = (float *)input;
  bVar1 = io::CodedInputStream::ReadLittleEndian32(input,&local_24);
  if (bVar1) {
    fVar2 = DecodeFloat(local_24);
    *pfStack_20 = fVar2;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<float, WireFormatLite::TYPE_FLOAT>(
    io::CodedInputStream* input,
    float* value) {
  uint32 temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = DecodeFloat(temp);
  return true;
}